

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  TestEventListeners *this_00;
  ulong uVar2;
  ostream *poVar3;
  ostream *poVar4;
  UnitTestImpl *in_RDI;
  string *output_format;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  TestEventListener *in_stack_ffffffffffffff28;
  TestEventListeners *in_stack_ffffffffffffff30;
  XmlUnitTestResultPrinter *this_01;
  GTestLog local_90;
  undefined1 local_89;
  string local_88 [20];
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  GTestLogSeverity in_stack_ffffffffffffff9c;
  GTestLog *in_stack_ffffffffffffffa0;
  XmlUnitTestResultPrinter local_30;
  
  this_01 = &local_30;
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_30.output_file_.field_2._8_8_ = this_01;
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    listeners(in_RDI);
    operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    std::__cxx11::string::c_str();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_01,(char *)in_RDI);
    TestEventListeners::SetDefaultXmlGenerator(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (bVar1) {
      listeners(in_RDI);
      this_00 = (TestEventListeners *)operator_new(0x28);
      local_89 = 1;
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      std::__cxx11::string::c_str();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                ((JsonUnitTestResultPrinter *)this_01,(char *)in_RDI);
      local_89 = 0;
      TestEventListeners::SetDefaultXmlGenerator(this_00,in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_88);
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        GTestLog::GTestLog(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                           in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        poVar3 = GTestLog::GetStream(&local_90);
        poVar3 = std::operator<<(poVar3,"WARNING: unrecognized output format \"");
        poVar4 = std::operator<<(poVar3,(string *)local_30.output_file_.field_2._8_8_);
        std::operator<<(poVar4,"\" ignored.");
        GTestLog::~GTestLog((GTestLog *)poVar3);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
#if GTEST_HAS_FILE_SYSTEM
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format == "json") {
    listeners()->SetDefaultXmlGenerator(new JsonUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (!output_format.empty()) {
    GTEST_LOG_(WARNING) << "WARNING: unrecognized output format \""
                        << output_format << "\" ignored.";
  }
#else
  if (!output_format.empty()) {
    GTEST_LOG_(ERROR) << "ERROR: alternative output formats require "
                      << "GTEST_HAS_FILE_SYSTEM to be enabled";
  }
#endif  // GTEST_HAS_FILE_SYSTEM
}